

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status leveldb::anon_unknown_1::PosixError(string *context,int error_number)

{
  int in_EDX;
  Slice *in_RDI;
  Slice *pSVar1;
  Slice *in_stack_ffffffffffffffa8;
  
  pSVar1 = in_RDI;
  if (in_EDX == 2) {
    Slice::Slice(in_RDI,(string *)in_RDI);
    strerror(2);
    Slice::Slice(pSVar1,(char *)in_RDI);
    Status::NotFound(in_stack_ffffffffffffffa8,pSVar1);
  }
  else {
    Slice::Slice(in_RDI,(string *)in_RDI);
    strerror(in_EDX);
    Slice::Slice(pSVar1,(char *)in_RDI);
    Status::IOError(in_stack_ffffffffffffffa8,pSVar1);
  }
  return (Status)(char *)pSVar1;
}

Assistant:

Status PosixError(const std::string& context, int error_number) {
  if (error_number == ENOENT) {
    return Status::NotFound(context, std::strerror(error_number));
  } else {
    return Status::IOError(context, std::strerror(error_number));
  }
}